

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraInit_cpp.h
# Opt level: O2

void __thiscall moira::Moira::createJumpTable(Moira *this,Model cpuModel,Model dasmModel)

{
  char cVar1;
  char cVar2;
  
  cVar2 = (cpuModel != M68010) + '\x01';
  if (cpuModel == M68000) {
    cVar2 = '\0';
  }
  cVar1 = (dasmModel != M68010) + '\x01';
  if (dasmModel == M68000) {
    cVar1 = '\0';
  }
  if (cVar1 == '\x02') {
    createJumpTable<(moira::Core)2>(this,dasmModel,true);
  }
  else if (cVar1 == '\x01') {
    createJumpTable<(moira::Core)1>(this,dasmModel,true);
  }
  else {
    createJumpTable<(moira::Core)0>(this,dasmModel,true);
  }
  if (cpuModel == dasmModel) {
    return;
  }
  if (cVar2 == '\x02') {
    createJumpTable<(moira::Core)2>(this,cpuModel,false);
    return;
  }
  if (cVar2 == '\x01') {
    createJumpTable<(moira::Core)1>(this,cpuModel,false);
    return;
  }
  createJumpTable<(moira::Core)0>(this,cpuModel,false);
  return;
}

Assistant:

void
Moira::createJumpTable(Model cpuModel, Model dasmModel)
{
    auto core = [&](Model model) {
        
        switch (model) {
                
            case Model::M68000: return Core::C68000;
            case Model::M68010: return Core::C68010;
                
            default:
                return Core::C68020;
        }
    };

    Core cpuCore = core(cpuModel);
    Core dasmCore = core(dasmModel);

    // Register handlers based on the dasm model
    if (dasmCore == Core::C68000) createJumpTable<Core::C68000>(dasmModel, true);
    if (dasmCore == Core::C68010) createJumpTable<Core::C68010>(dasmModel, true);
    if (dasmCore == Core::C68020) createJumpTable<Core::C68020>(dasmModel, true);

    // If both models differ, overwrite the exec handlers
    if (cpuModel != dasmModel) {

        if (cpuCore == Core::C68000) createJumpTable<Core::C68000>(cpuModel, false);
        if (cpuCore == Core::C68010) createJumpTable<Core::C68010>(cpuModel, false);
        if (cpuCore == Core::C68020) createJumpTable<Core::C68020>(cpuModel, false);
    }
}